

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  uint uVar2;
  BufferMode bufferMode;
  Context *pCVar3;
  int iVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  char *pcVar6;
  long *plVar7;
  anon_struct_16_2_f7718127 *paVar8;
  TestNode *pTVar9;
  UniformBlockCase *pUVar10;
  long *plVar11;
  size_type *psVar12;
  long lVar13;
  long lVar14;
  undefined8 in_R9;
  int iVar15;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  string baseName;
  allocator<char> local_c9;
  TestNode *local_c8;
  anon_struct_16_2_f7718127 *local_c0;
  TestNode *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  TestNode *local_90;
  long local_88;
  long local_80;
  VarType childType;
  VarType parentType_1;
  VarType parentType;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_array","2-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar13 = 0;
  local_b8 = pTVar5;
  do {
    pTVar5 = (TestNode *)operator_new(0x70);
    local_c8 = (TestNode *)lVar13;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[lVar13].name,SSBOArrayLengthTests::init::arraysSized + 1);
    local_c0 = init::layoutFlags + lVar13;
    tcu::TestNode::addChild(local_b8,pTVar5);
    lVar13 = 0;
    do {
      DVar1 = init::basicTypes[lVar13];
      pcVar6 = glu::getDataTypeName(DVar1);
      gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      gls::ub::VarType::VarType(&childType,(VarType *)&baseName,4);
      gls::ub::VarType::~VarType((VarType *)&baseName);
      gls::ub::VarType::VarType(&parentType,&childType,3);
      uVar2 = local_c0->flags;
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,pcVar6,&parentType,
                 uVar2,(int)in_R9);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar14 = 0;
        do {
          pCVar3 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b0,*(char **)((long)&init::matrixFlags[0].name + lVar14),
                     (allocator<char> *)&parentType_1);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_b0);
          local_128 = &local_118;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_118 = *plVar11;
            lStack_110 = plVar7[3];
          }
          else {
            local_118 = *plVar11;
            local_128 = (long *)*plVar7;
          }
          local_120 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar12 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar12) {
            baseName.field_2._M_allocated_capacity = *psVar12;
            baseName.field_2._8_8_ = plVar7[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar12;
            baseName._M_dataplus._M_p = (pointer)*plVar7;
          }
          baseName._M_string_length = plVar7[1];
          *plVar7 = (long)psVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar5,pCVar3,baseName._M_dataplus._M_p,&parentType,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar14) | uVar2,(int)in_R9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          lVar14 = lVar14 + 0x10;
        } while (lVar14 == 0x10);
      }
      gls::ub::VarType::~VarType(&parentType);
      gls::ub::VarType::~VarType(&childType);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x19);
    lVar13 = (long)local_c8 + 1;
  } while (lVar13 != 3);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "3_level_array","3-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  paVar8 = (anon_struct_16_2_f7718127 *)0x0;
  local_c8 = pTVar5;
  do {
    pTVar5 = local_c8;
    pTVar9 = (TestNode *)operator_new(0x70);
    local_c0 = paVar8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(long)paVar8].name,SSBOArrayLengthTests::init::arraysSized + 1);
    tcu::TestNode::addChild(pTVar5,pTVar9);
    lVar13 = 0;
    do {
      DVar1 = init::basicTypes[lVar13];
      pcVar6 = glu::getDataTypeName(DVar1);
      gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      gls::ub::VarType::VarType(&childType,(VarType *)&baseName,2);
      gls::ub::VarType::~VarType((VarType *)&baseName);
      gls::ub::VarType::VarType(&parentType,&childType,4);
      gls::ub::VarType::VarType(&parentType_1,&parentType,3);
      uVar2 = init::layoutFlags[(long)paVar8].flags;
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar9,(this->super_TestCaseGroup).m_context,pcVar6,&parentType_1,
                 uVar2,(int)in_R9);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar14 = 0;
        do {
          pCVar3 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b0,*(char **)((long)&init::matrixFlags[0].name + lVar14),
                     &local_c9);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_b0);
          local_128 = &local_118;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_118 = *plVar11;
            lStack_110 = plVar7[3];
          }
          else {
            local_118 = *plVar11;
            local_128 = (long *)*plVar7;
          }
          local_120 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar12 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar12) {
            baseName.field_2._M_allocated_capacity = *psVar12;
            baseName.field_2._8_8_ = plVar7[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar12;
            baseName._M_dataplus._M_p = (pointer)*plVar7;
          }
          baseName._M_string_length = plVar7[1];
          *plVar7 = (long)psVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar9,pCVar3,baseName._M_dataplus._M_p,&parentType_1,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar14) | uVar2,(int)in_R9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          lVar14 = lVar14 + 0x10;
        } while (lVar14 == 0x10);
      }
      gls::ub::VarType::~VarType(&parentType_1);
      gls::ub::VarType::~VarType(&parentType);
      gls::ub::VarType::~VarType(&childType);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x19);
    paVar8 = (anon_struct_16_2_f7718127 *)((long)&local_c0->name + 1);
  } while (paVar8 != (anon_struct_16_2_f7718127 *)0x3);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar13 = 0;
  local_90 = pTVar5;
  do {
    pTVar5 = local_90;
    pTVar9 = (TestNode *)operator_new(0x70);
    local_88 = lVar13;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar13].name,SSBOArrayLengthTests::init::arraysSized + 1);
    tcu::TestNode::addChild(pTVar5,pTVar9);
    lVar14 = 0;
    local_c8 = (TestNode *)(init::bufferModes + lVar13);
    do {
      local_b8 = (TestNode *)(init::layoutFlags + lVar14);
      local_c0 = (anon_struct_16_2_f7718127 *)init::layoutFlags[lVar14].name;
      iVar15 = 0;
      local_80 = lVar14;
      do {
        pTVar5 = local_c8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_c0,(allocator<char> *)&local_128);
        bufferMode = *(BufferMode *)&pTVar5->m_testCtx;
        if (bufferMode != BUFFERMODE_SINGLE || iVar15 != 0) {
          uVar2 = *(uint *)&local_b8->m_testCtx;
          if (iVar15 != 0) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pUVar10 = (UniformBlockCase *)operator_new(0xb8);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,baseName._M_dataplus._M_p,
                     baseName._M_dataplus._M_p + baseName._M_string_length);
          std::__cxx11::string::append((char *)&local_128);
          gls::UniformBlockCase::UniformBlockCase
                    (pUVar10,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_128,
                     SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,bufferMode);
          iVar4 = (uint)(iVar15 != 0) * 3;
          (pUVar10->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00b546b8;
          *(uint *)&pUVar10[1].super_TestCase.super_TestNode._vptr_TestNode = uVar2 | 0x100;
          *(int *)((long)&pUVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar10);
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          pUVar10 = (UniformBlockCase *)operator_new(0xb8);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,baseName._M_dataplus._M_p,
                     baseName._M_dataplus._M_p + baseName._M_string_length);
          std::__cxx11::string::append((char *)&local_128);
          gls::UniformBlockCase::UniformBlockCase
                    (pUVar10,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_128,
                     SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,bufferMode);
          (pUVar10->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00b546b8;
          *(uint *)&pUVar10[1].super_TestCase.super_TestNode._vptr_TestNode = uVar2 | 0x200;
          *(int *)((long)&pUVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar10);
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if ((uVar2 & 0x10) == 0) {
            pUVar10 = (UniformBlockCase *)operator_new(0xb8);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            local_128 = &local_118;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_128);
            gls::UniformBlockCase::UniformBlockCase
                      (pUVar10,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_128,
                       SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,bufferMode);
            (pUVar10->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_00b546b8;
            *(uint *)&pUVar10[1].super_TestCase.super_TestNode._vptr_TestNode = uVar2 | 0x300;
            *(int *)((long)&pUVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
            tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar10);
            if (local_128 != &local_118) {
              operator_delete(local_128,local_118 + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)baseName._M_dataplus._M_p != &baseName.field_2) {
          operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 == 1);
      lVar14 = local_80 + 1;
    } while (lVar14 != 3);
    lVar13 = local_88 + 1;
  } while (local_88 == 0);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"basic_type_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0xffc7,0x19,0x47e);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffffffff,0x32,0x2bc0);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffffffff,0x32,0x2bf2);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.2_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_array", "2-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize	= 4;
				const int			parentSize	= 3;
				const VarType		childType	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize);
				const VarType		parentType	(childType, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.3_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "3_level_array", "3-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize0	= 2;
				const int			childSize1	= 4;
				const int			parentSize	= 3;
				const VarType		childType0	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize0);
				const VarType		childType1	(childType0, childSize1);
				const VarType		parentType	(childType1, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.2_level_struct_array
	{
		tcu::TestCaseGroup* structArrayArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_struct_array", "Struct array in one uniform block");
		addChild(structArrayArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			structArrayArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_both").c_str(),	"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	basicTypeArrays	= allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS|FEATURE_ARRAYS_OF_ARRAYS;
		const deUint32	allFeatures		= ~0u;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		createRandomCaseGroup(randomGroup, m_context, "basic_type_arrays",		"Arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	basicTypeArrays,	25, 1150);
		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,		50, 11200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,		50, 11250);
	}
}